

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_updates_the_subject_set_by_edition_Test::
SubjectSetRegisterTest_next_subscription_sync_updates_the_subject_set_by_edition_Test
          (SubjectSetRegisterTest_next_subscription_sync_updates_the_subject_set_by_edition_Test
           *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00273f70;
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_updates_the_subject_set_by_edition)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_SUBJECT1, false);

    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    ASSERT_TRUE(message);
    auto subject_set = subject_register.SubjectSetByEdition(message->GetEdition());
    std::vector<Subject> set_comparison1 = {SS_SUBJECT0, SS_SUBJECT1};
    EXPECT_EQ(set_comparison1, *subject_set);

    subject_register.Register(SS_SUBJECT2, false);
    message = subject_register.NextSubscriptionSync();
    ASSERT_TRUE(message);
    subject_set = subject_register.SubjectSetByEdition(message->GetEdition());
    std::vector<Subject> set_comparison2 = {SS_SUBJECT0, SS_SUBJECT1, SS_SUBJECT2};
    EXPECT_EQ(set_comparison2, *subject_set);
}